

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
::~Vector_column(Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                 *this)

{
  pointer ppEVar1;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  *pEVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  node_ptr next;
  pointer ppEVar5;
  
  ppEVar1 = (this->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar5 = (this->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar5 != ppEVar1;
      ppEVar5 = ppEVar5 + 1) {
    pEVar2 = *ppEVar5;
    if (((this->super_Row_access_option).rows_ != (Row_container *)0x0) &&
       (plVar3 = (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
       plVar3 != (node_ptr)0x0)) {
      plVar4 = (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar4->next_ = plVar3;
      plVar3->prev_ = plVar4;
      (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
      (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    }
    if (pEVar2 != (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                   *)0x0) {
      plVar3 = (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_;
      if (plVar3 != (node_ptr)0x0) {
        plVar4 = (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
        plVar4->next_ = plVar3;
        plVar3->prev_ = plVar4;
        (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
        ;
        (pEVar2->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
        ;
      }
      operator_delete(pEVar2,0x20);
    }
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->erasedValues_)._M_h);
  ppEVar5 = (this->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar5 != (pointer)0x0) {
    operator_delete(ppEVar5,(long)(this->column_).
                                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar5
                   );
    return;
  }
  return;
}

Assistant:

inline Vector_column<Master_matrix>::~Vector_column()
{
  for (auto* entry : column_) {
    _delete_entry(entry);
  }
}